

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

int __thiscall V2Reverb::init(V2Reverb *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  *(float **)&this->field_0x30 = this->bcombl0;
  *(undefined4 *)&this->field_0x2c = 0x51d;
  memset(this->bcombl0,0,0x1474);
  *(undefined4 *)&this->field_0x28 = 0;
  *(float **)&this->field_0x40 = this->bcombl1;
  *(undefined4 *)&this->field_0x3c = 0x663;
  memset(this->bcombl1,0,0x198c);
  *(undefined4 *)&this->field_0x38 = 0;
  *(float **)&this->field_0x50 = this->bcombl2;
  *(undefined4 *)&this->field_0x4c = 0x713;
  memset(this->bcombl2,0,0x1c4c);
  *(undefined4 *)&this->field_0x48 = 0;
  *(float **)&this->field_0x60 = this->bcombl3;
  *(undefined4 *)&this->field_0x5c = 0x786;
  memset(this->bcombl3,0,0x1e18);
  *(undefined4 *)&this->field_0x58 = 0;
  *(float **)&this->field_0xd0 = this->balll0;
  *(undefined4 *)&this->field_0xcc = 0xdc;
  memset(this->balll0,0,0x370);
  *(undefined4 *)&this->field_0xc8 = 0;
  *(float **)&this->field_0xe0 = this->balll1;
  *(undefined4 *)&this->field_0xdc = 0x4a;
  memset(this->balll1,0,0x128);
  *(undefined4 *)&this->field_0xd8 = 0;
  *(float **)&this->field_0x70 = this->bcombr0;
  *(undefined4 *)&this->field_0x6c = 0x52f;
  memset(this->bcombr0,0,0x14bc);
  *(undefined4 *)&this->field_0x68 = 0;
  *(float **)&this->field_0x80 = this->bcombr1;
  *(undefined4 *)&this->field_0x7c = 0x65f;
  memset(this->bcombr1,0,0x197c);
  *(undefined4 *)&this->field_0x78 = 0;
  *(float **)&this->field_0x90 = this->bcombr2;
  *(undefined4 *)&this->field_0x8c = 0x729;
  memset(this->bcombr2,0,0x1ca4);
  *(undefined4 *)&this->field_0x88 = 0;
  *(float **)&this->field_0xa0 = this->bcombr3;
  *(undefined4 *)&this->field_0x9c = 0x76d;
  memset(this->bcombr3,0,0x1db4);
  *(undefined4 *)&this->field_0x98 = 0;
  *(float **)&this->field_0xf0 = this->ballr0;
  *(undefined4 *)&this->field_0xec = 0xcd;
  memset(this->ballr0,0,0x334);
  *(undefined4 *)&this->field_0xe8 = 0;
  *(float **)&this->field_0x100 = this->ballr1;
  *(undefined4 *)&this->field_0xfc = 0x4d;
  memset(this->ballr1,0,0x134);
  *(undefined4 *)&this->field_0xf8 = 0;
  this->inst = (V2Instance *)ctx;
  reset(this);
  return extraout_EAX;
}

Assistant:

void init(V2Instance *instance)
    {
        // init filters
        combd[0][0].init(bcombl0);
        combd[0][1].init(bcombl1);
        combd[0][2].init(bcombl2);
        combd[0][3].init(bcombl3);
        alld[0][0].init(balll0);
        alld[0][1].init(balll1);
        combd[1][0].init(bcombr0);
        combd[1][1].init(bcombr1);
        combd[1][2].init(bcombr2);
        combd[1][3].init(bcombr3);
        alld[1][0].init(ballr0);
        alld[1][1].init(ballr1);

        inst = instance;
        reset();
    }